

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ConfidentialTransaction * __thiscall
cfd::core::ConfidentialTransaction::operator=
          (ConfidentialTransaction *this,ConfidentialTransaction *transaction)

{
  string local_38;
  ConfidentialTransaction *local_18;
  ConfidentialTransaction *transaction_local;
  ConfidentialTransaction *this_local;
  
  if (this != transaction) {
    local_18 = transaction;
    transaction_local = this;
    AbstractTransaction::GetHex_abi_cxx11_(&local_38,&transaction->super_AbstractTransaction);
    SetFromHex(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

ConfidentialTransaction &ConfidentialTransaction::operator=(
    const ConfidentialTransaction &transaction) & {
  if (this != &transaction) {
    SetFromHex(transaction.GetHex());
  }
  return *this;
}